

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitFromImage::prepare
          (ImageBlitFromImage *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Context *pCVar1;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkQueue pVVar2;
  deUint64 dVar3;
  deUint32 dVar4;
  VkResult result;
  void *pvVar5;
  VkCommandBufferLevel level;
  ulong size;
  size_t ndx;
  ulong uVar7;
  undefined8 uVar9;
  VkMemoryPropertyFlags in_stack_fffffffffffffe08;
  VkMemoryPropertyFlags properties;
  RefBase<vk::VkCommandBuffer_s_*> local_1b8;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_198;
  undefined8 local_178;
  undefined4 local_170;
  int local_16c;
  int local_168;
  deUint32 local_164;
  VkQueue local_158;
  Move<vk::Handle<(vk::HandleType)9>_> *local_150;
  VkCommandPool local_148;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_128;
  undefined8 local_108;
  deUint64 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  deUint32 local_e8;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_d8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_b8;
  Random rng;
  undefined1 local_88 [16];
  VkDevice local_78;
  VkFormat VStack_70;
  deUint32 dStack_6c;
  deUint32 dStack_68;
  deUint32 dStack_64;
  deUint32 dStack_60;
  deUint32 dStack_5c;
  VkSampleCountFlagBits VStack_58;
  VkImageTiling local_54;
  VkImageUsageFlags VStack_50;
  VkSharingMode local_4c;
  deUint32 local_48;
  pointer local_40;
  VkImageLayout local_38;
  VkDevice pVVar6;
  int iVar8;
  int iVar10;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  
  pCVar1 = context->m_context;
  vki = pCVar1->m_vki;
  vk = pCVar1->m_vkd;
  physicalDevice = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  pVVar2 = pCVar1->m_queue;
  dVar3 = (pCVar1->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
          m_internal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140,
             &pCVar1->m_queueFamilies);
  uVar9._0_4_ = context->m_currentImageWidth;
  uVar9._4_4_ = context->m_currentImageHeight;
  this->m_imageWidth = (undefined4)uVar9;
  this->m_imageHeight = uVar9._4_4_;
  this->m_imageMemorySize = context->m_currentImageMemorySize;
  if (this->m_scale == BLIT_SCALE_20) {
    iVar8 = (int)(undefined4)uVar9 / 2;
    iVar10 = (int)uVar9._4_4_ / 2;
    uVar9 = CONCAT44(iVar10,iVar8);
    this->m_srcImageWidth = iVar8;
    this->m_srcImageHeight = iVar10;
  }
  else if (this->m_scale == BLIT_SCALE_10) {
    this->m_srcImageWidth = (undefined4)uVar9;
    this->m_srcImageHeight = uVar9._4_4_;
  }
  else {
    uVar9._0_4_ = this->m_srcImageWidth;
    uVar9._4_4_ = this->m_srcImageHeight;
  }
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)&DAT_100000000;
  VStack_70 = VK_FORMAT_R8G8B8A8_UNORM;
  dStack_6c = (deUint32)uVar9;
  dStack_68 = (deUint32)((ulong)uVar9 >> 0x20);
  dStack_64 = 1;
  dStack_60 = 1;
  dStack_5c = 1;
  VStack_58 = VK_SAMPLE_COUNT_1_BIT;
  local_54 = VK_IMAGE_TILING_OPTIMAL;
  VStack_50 = 3;
  local_4c = VK_SHARING_MODE_EXCLUSIVE;
  local_48 = (deUint32)
             ((ulong)((long)local_140._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_140._M_impl.super__Vector_impl_data._M_start) >> 2);
  local_40 = local_140._M_impl.super__Vector_impl_data._M_start;
  local_38 = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_198,vk,device,
                    (VkImageCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  local_128.m_data.deleter.m_device = local_198.m_data.deleter.m_device;
  local_128.m_data.deleter.m_allocator = local_198.m_data.deleter.m_allocator;
  local_128.m_data.object.m_internal = local_198.m_data.object.m_internal;
  local_128.m_data.deleter.m_deviceIface = local_198.m_data.deleter.m_deviceIface;
  local_198.m_data.object.m_internal = 0;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_198.m_data.deleter.m_device = (VkDevice)0x0;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_srcImage;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_128.m_data.deleter.m_device;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_128.m_data.deleter.m_allocator;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       local_128.m_data.object.m_internal;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_128.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_198);
  bindImageMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&local_128,vki,vk,physicalDevice,device,
                  (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                           m_internal,in_stack_fffffffffffffe08);
  local_78 = local_128.m_data.deleter.m_device;
  VStack_70 = (VkFormat)local_128.m_data.deleter.m_allocator;
  dStack_6c = (deUint32)((ulong)local_128.m_data.deleter.m_allocator >> 0x20);
  local_88._0_8_ = local_128.m_data.object.m_internal;
  local_88._8_8_ = local_128.m_data.deleter.m_deviceIface;
  local_128.m_data.object.m_internal = 0;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_128.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_158 = pVVar2;
  local_148.m_internal = dVar3;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
            (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = local_78;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(dStack_6c,VStack_70);
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_88._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_88._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_128);
  queueFamilies = &local_140;
  dVar4 = 1;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_88,vk,device,
               (long)(this->m_srcImageWidth * this->m_srcImageHeight * 4),1,
               VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)queueFamilies);
  properties = (VkMemoryPropertyFlags)queueFamilies;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)CONCAT44(dStack_6c,VStack_70);
  local_b8.m_data.deleter.m_device = local_78;
  local_b8.m_data.object.m_internal = local_88._0_8_;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_88._8_8_;
  local_88._0_8_ = 0;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x0;
  VStack_70 = VK_FORMAT_UNDEFINED;
  dStack_6c = 0;
  local_150 = this_00;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_88);
  pVVar6 = device;
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)local_88,vki,vk,physicalDevice,device,
                   (VkBuffer)local_b8.m_data.object.m_internal,properties);
  level = (VkCommandBufferLevel)pVVar6;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)CONCAT44(dStack_6c,VStack_70);
  local_d8.m_data.deleter.m_device = local_78;
  local_d8.m_data.object.m_internal = local_88._0_8_;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_88._8_8_;
  local_88._0_8_ = (VkCommandBuffer)0x0;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x0;
  VStack_70 = VK_FORMAT_UNDEFINED;
  dStack_6c = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_88);
  createBeginCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_88,vk,device,local_148,level);
  local_1b8.m_data.deleter.m_pool.m_internal = CONCAT44(dStack_6c,VStack_70);
  local_1b8.m_data.deleter.m_device = local_78;
  local_1b8.m_data.object = (VkCommandBuffer_s *)local_88._0_8_;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_88._8_8_;
  local_88._0_8_ = 0;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x0;
  VStack_70 = VK_FORMAT_UNDEFINED;
  dStack_6c = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_88);
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x100000000000;
  VStack_70 = VK_FORMAT_UNDEFINED;
  dStack_6c = 7;
  dStack_68 = 0xffffffff;
  dStack_64 = 0xffffffff;
  local_100 = (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
              m_internal;
  dStack_60 = (deUint32)local_100;
  dStack_5c = (deUint32)(local_100 >> 0x20);
  local_128.m_data.object.m_internal._0_4_ = 0x2d;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  VStack_58 = VK_SAMPLE_COUNT_1_BIT;
  local_54 = VK_IMAGE_TILING_OPTIMAL;
  VStack_50 = 1;
  local_4c = VK_SHARING_MODE_EXCLUSIVE;
  local_128.m_data.deleter.m_device = (VkDevice)0x1000;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x600000007;
  local_108 = 0xffffffffffffffff;
  local_f8 = 1;
  uStack_f0 = 1;
  local_198.m_data.object.m_internal = 0;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_198.m_data.deleter.m_device = (VkDevice)0x1;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)&DAT_100000000;
  local_178 = 0;
  local_170 = 0;
  local_16c = this->m_srcImageWidth;
  local_168 = this->m_srcImageHeight;
  local_164 = dVar4;
  local_e8 = dVar4;
  local_48 = dVar4;
  pvVar5 = mapMemory(vk,device,(VkDeviceMemory)local_d8.m_data.object.m_internal,
                     (long)(local_16c * local_168 * 4));
  deRandom_init(&rng.m_rnd,this->m_seed);
  for (uVar7 = 0; size = (ulong)(this->m_srcImageWidth * this->m_srcImageHeight * 4), uVar7 < size;
      uVar7 = uVar7 + 1) {
    dVar4 = deRandom_getUint32(&rng.m_rnd);
    *(char *)((long)pvVar5 + uVar7) = (char)dVar4;
  }
  ::vk::flushMappedMemoryRange(vk,device,(VkDeviceMemory)local_d8.m_data.object.m_internal,0,size);
  (*vk->_vptr_DeviceInterface[8])(vk,device,local_d8.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_1b8.m_data.object,0x10000,0x1000,0,0,0,0,0,1,
             (RefBase<vk::VkCommandBuffer_s_*> *)local_88);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,local_1b8.m_data.object,local_b8.m_data.object.m_internal,
             (local_150->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,7,1
             ,&local_198);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_1b8.m_data.object,0x1000,0x1000,0,0,0,0,0,1,&local_128);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_1b8.m_data.object);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xecd);
  queueRun(vk,local_158,local_1b8.m_data.object);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_1b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_140);
  return;
}

Assistant:

void ImageBlitFromImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	if (m_scale == BLIT_SCALE_10)
	{
		m_srcImageWidth			= m_imageWidth;
		m_srcImageHeight		= m_imageHeight;
	}
	else if (m_scale == BLIT_SCALE_20)
	{
		m_srcImageWidth			= m_imageWidth / 2;
		m_srcImageHeight		= m_imageHeight / 2;
	}
	else
		DE_FATAL("Unsupported scale");

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_srcImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_srcImage, 0);

	{
		const vk::Unique<vk::VkBuffer>			srcBuffer		(createBuffer(vkd, device, 4 * m_srcImageWidth * m_srcImageHeight, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
		const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			preImageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkImageMemoryBarrier			postImageBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			0,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferImageCopy				region				=
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u
			}
		};

		{
			void* const	ptr	= mapMemory(vkd, device, *memory, 4 * m_srcImageWidth * m_srcImageHeight);
			de::Random	rng	(m_seed);

			{
				deUint8* const	data = (deUint8*)ptr;

				for (size_t ndx = 0; ndx < (size_t)(4 * m_srcImageWidth * m_srcImageHeight); ndx++)
					data[ndx] = rng.getUint8();
			}

			vk::flushMappedMemoryRange(vkd, device, *memory, 0, 4 * m_srcImageWidth * m_srcImageHeight);
			vkd.unmapMemory(device, *memory);
		}

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
		vkd.cmdCopyBufferToImage(*commandBuffer, *srcBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}